

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngget.c
# Opt level: O2

png_uint_32
png_get_sCAL(png_const_structrp png_ptr,png_const_inforp info_ptr,int *unit,double *width,
            double *height)

{
  png_uint_32 pVar1;
  double dVar2;
  
  pVar1 = 0;
  if ((info_ptr != (png_const_inforp)0x0 && png_ptr != (png_const_structrp)0x0) &&
     (pVar1 = 0, (info_ptr->valid & 0x4000) != 0)) {
    *unit = (uint)info_ptr->scal_unit;
    dVar2 = atof(info_ptr->scal_s_width);
    *width = dVar2;
    dVar2 = atof(info_ptr->scal_s_height);
    *height = dVar2;
    pVar1 = 0x4000;
  }
  return pVar1;
}

Assistant:

png_uint_32 PNGAPI
png_get_sCAL(png_const_structrp png_ptr, png_const_inforp info_ptr,
    int *unit, double *width, double *height)
{
   if (png_ptr != NULL && info_ptr != NULL &&
       (info_ptr->valid & PNG_INFO_sCAL) != 0)
   {
      *unit = info_ptr->scal_unit;
      *width = atof(info_ptr->scal_s_width);
      *height = atof(info_ptr->scal_s_height);
      return (PNG_INFO_sCAL);
   }

   return(0);
}